

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.cpp
# Opt level: O2

void __thiscall xercesc_4_0::XMLDateTime::parseDuration(XMLDateTime *this)

{
  XMLCh XVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  SchemaDateTimeException *this_00;
  XMLCh *pXVar7;
  XMLSize_t end;
  uint uVar8;
  XMLSize_t XVar9;
  double dVar10;
  XMLSize_t XStackY_60;
  
  pXVar7 = this->fBuffer;
  if ((pXVar7 == (XMLCh *)0x0) || (XVar1 = *pXVar7, XVar1 == L'\0')) {
    this_00 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
    pXVar7 = this->fBuffer;
    if (pXVar7 == (XMLCh *)0x0) {
      pXVar7 = L"";
    }
    SchemaDateTimeException::SchemaDateTimeException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
               ,0x36e,DateTime_dur_invalid,pXVar7,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
               this->fMemoryManager);
  }
  else {
    this->fStart = 1;
    if (XVar1 == L'-') {
      this->fStart = 2;
      if (pXVar7[1] != L'P') {
        this_00 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
        SchemaDateTimeException::SchemaDateTimeException
                  (this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
                   ,899,DateTime_dur_noP,this->fBuffer,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                   this->fMemoryManager);
        goto LAB_00264888;
      }
      XStackY_60 = 2;
    }
    else {
      if (XVar1 != L'P') {
        this_00 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
        SchemaDateTimeException::SchemaDateTimeException
                  (this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
                   ,0x379,DateTime_dur_Start_dashP,this->fBuffer,(XMLCh *)0x0,(XMLCh *)0x0,
                   (XMLCh *)0x0,this->fMemoryManager);
        goto LAB_00264888;
      }
      XStackY_60 = 1;
    }
    this->fValue[7] = (uint)(XVar1 == L'-') * 2 + 1;
    XVar9 = this->fEnd;
    iVar3 = indexOf(this,XStackY_60,XVar9,L'-');
    if (iVar3 == -1) {
      uVar8 = -(uint)(XVar1 == L'-') | 1;
      iVar4 = indexOf(this,XStackY_60,XVar9,L'T');
      iVar3 = (int)XVar9;
      if (iVar4 != -1) {
        iVar3 = iVar4;
      }
      XVar9 = (XMLSize_t)iVar3;
      iVar3 = indexOf(this,XStackY_60,XVar9,L'Y');
      if (iVar3 != -1) {
        iVar4 = parseInt(this,XStackY_60,(long)iVar3);
        this->fValue[0] = iVar4 * uVar8;
        XStackY_60 = (XMLSize_t)(iVar3 + 1);
        this->fStart = XStackY_60;
      }
      iVar4 = indexOf(this,XStackY_60,XVar9,L'M');
      if (iVar4 != -1) {
        iVar5 = parseInt(this,XStackY_60,(long)iVar4);
        this->fValue[1] = iVar5 * uVar8;
        XStackY_60 = (XMLSize_t)(iVar4 + 1);
        this->fStart = XStackY_60;
      }
      iVar5 = indexOf(this,XStackY_60,XVar9,L'D');
      if (iVar5 != -1) {
        iVar6 = parseInt(this,XStackY_60,(long)iVar5);
        this->fValue[2] = iVar6 * uVar8;
        XStackY_60 = (XMLSize_t)(iVar5 + 1);
        this->fStart = XStackY_60;
      }
      bVar2 = iVar5 != -1 || (iVar4 != -1 || iVar3 != -1);
      end = this->fEnd;
      if ((end == XVar9) && (XStackY_60 != end)) {
        this_00 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
        SchemaDateTimeException::SchemaDateTimeException
                  (this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
                   ,0x3c5,DateTime_dur_inv_b4T,this->fBuffer,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                   this->fMemoryManager);
      }
      else {
        if (end != XVar9) {
          XStackY_60 = XStackY_60 + 1;
          this->fStart = XStackY_60;
          iVar3 = indexOf(this,XStackY_60,end,L'H');
          if (iVar3 != -1) {
            iVar4 = parseInt(this,XStackY_60,(long)iVar3);
            this->fValue[3] = iVar4 * uVar8;
            XStackY_60 = (XMLSize_t)(iVar3 + 1);
            this->fStart = XStackY_60;
            end = this->fEnd;
          }
          iVar4 = indexOf(this,XStackY_60,end,L'M');
          if (iVar4 != -1) {
            iVar5 = parseInt(this,XStackY_60,(long)iVar4);
            this->fValue[4] = iVar5 * uVar8;
            XStackY_60 = (XMLSize_t)(iVar4 + 1);
            this->fStart = XStackY_60;
            end = this->fEnd;
          }
          bVar2 = iVar4 != -1 || (iVar3 != -1 || bVar2);
          iVar3 = indexOf(this,XStackY_60,end,L'S');
          if (iVar3 != -1) {
            XVar9 = (XMLSize_t)iVar3;
            iVar4 = indexOf(this,XStackY_60,XVar9,L'.');
            if (iVar4 == -1) {
              iVar4 = parseInt(this,XStackY_60,XVar9);
              this->fValue[5] = iVar4 * uVar8;
            }
            else {
              if (iVar4 + 1 == iVar3) {
                this_00 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
                SchemaDateTimeException::SchemaDateTimeException
                          (this_00,
                           "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
                           ,0x3f6,DateTime_dur_inv_seconds,this->fBuffer,(XMLCh *)0x0,(XMLCh *)0x0,
                           (XMLCh *)0x0,this->fMemoryManager);
                goto LAB_00264888;
              }
              iVar5 = parseInt(this,XStackY_60,(long)iVar4);
              this->fValue[5] = iVar5 * uVar8;
              dVar10 = parseMiliSecond(this,(long)(iVar4 + 1),XVar9);
              this->fMilliSecond = dVar10 * (double)(int)uVar8;
            }
            XStackY_60 = (XMLSize_t)(iVar3 + 1);
            this->fStart = XStackY_60;
            end = this->fEnd;
            bVar2 = true;
          }
          if ((XStackY_60 != end) || (this->fStart = end - 1, this->fBuffer[end - 1] == L'T')) {
            this_00 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
            SchemaDateTimeException::SchemaDateTimeException
                      (this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
                       ,0x40d,DateTime_dur_NoTimeAfterT,this->fBuffer,(XMLCh *)0x0,(XMLCh *)0x0,
                       (XMLCh *)0x0,this->fMemoryManager);
            goto LAB_00264888;
          }
        }
        if (bVar2) {
          return;
        }
        this_00 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
        SchemaDateTimeException::SchemaDateTimeException
                  (this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
                   ,0x416,DateTime_dur_NoElementAtAll,this->fBuffer,(XMLCh *)0x0,(XMLCh *)0x0,
                   (XMLCh *)0x0,this->fMemoryManager);
      }
    }
    else {
      this_00 = (SchemaDateTimeException *)__cxa_allocate_exception(0x30);
      SchemaDateTimeException::SchemaDateTimeException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
                 ,0x397,DateTime_dur_DashNotFirst,this->fBuffer,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0,this->fMemoryManager);
    }
  }
LAB_00264888:
  __cxa_throw(this_00,&SchemaDateTimeException::typeinfo,XMLException::~XMLException);
}

Assistant:

void XMLDateTime::parseDuration()
{
    if (!initParser())
        ThrowXMLwithMemMgr1(SchemaDateTimeException
                , XMLExcepts::DateTime_dur_invalid
                , fBuffer ? fBuffer : XMLUni::fgZeroLenString
                , fMemoryManager);

    // must start with '-' or 'P'
    //
    XMLCh c = fBuffer[fStart++];
    if ( (c != DURATION_STARTER) &&
         (c != chDash)            )
    {
        ThrowXMLwithMemMgr1(SchemaDateTimeException
                , XMLExcepts::DateTime_dur_Start_dashP
                , fBuffer
                , fMemoryManager);
    }

    // 'P' must ALWAYS be present in either case
    if ( (c == chDash) &&
         (fBuffer[fStart++]!= DURATION_STARTER ))
    {
        ThrowXMLwithMemMgr1(SchemaDateTimeException
                , XMLExcepts::DateTime_dur_noP
                , fBuffer
                , fMemoryManager);
    }

    // java code
    //date[utc]=(c=='-')?'-':0;
    //fValue[utc] = UTC_STD;
    fValue[utc] = (fBuffer[0] == chDash? UTC_NEG : UTC_STD);

    int negate = ( fBuffer[0] == chDash ? -1 : 1);

    //
    // No negative value is allowed after 'P'
    //
    // eg P-1234, invalid
    //
    if (indexOf(fStart, fEnd, chDash) != NOT_FOUND)
    {
        ThrowXMLwithMemMgr1(SchemaDateTimeException
                , XMLExcepts::DateTime_dur_DashNotFirst
                , fBuffer
                , fMemoryManager);
    }

    //at least one number and designator must be seen after P
    bool designator = false;

    int endDate = indexOf(fStart, fEnd, DATETIME_SEPARATOR);
    if ( endDate == NOT_FOUND )
    {
        endDate = (int)fEnd;  // 'T' absent
    }

    //find 'Y'
    int end = indexOf(fStart, endDate, DURATION_Y);
    if ( end != NOT_FOUND )
    {
        //scan year
        fValue[CentYear] = negate * parseInt(fStart, end);
        fStart = end+1;
        designator = true;
    }

    end = indexOf(fStart, endDate, DURATION_M);
    if ( end != NOT_FOUND )
    {
        //scan month
        fValue[Month] = negate * parseInt(fStart, end);
        fStart = end+1;
        designator = true;
    }

    end = indexOf(fStart, endDate, DURATION_D);
    if ( end != NOT_FOUND )
    {
        //scan day
        fValue[Day] = negate * parseInt(fStart,end);
        fStart = end+1;
        designator = true;
    }

    if ( (fEnd == XMLSize_t (endDate)) &&   // 'T' absent
         (fStart != fEnd)   )   // something after Day
    {
        ThrowXMLwithMemMgr1(SchemaDateTimeException
                , XMLExcepts::DateTime_dur_inv_b4T
                , fBuffer
                , fMemoryManager);
    }

    if ( fEnd != XMLSize_t (endDate) ) // 'T' present
    {
        //scan hours, minutes, seconds
        //

        // skip 'T' first
        end = indexOf(++fStart, fEnd, DURATION_H);
        if ( end != NOT_FOUND )
        {
            //scan hours
            fValue[Hour] = negate * parseInt(fStart, end);
            fStart = end+1;
            designator = true;
        }

        end = indexOf(fStart, fEnd, DURATION_M);
        if ( end != NOT_FOUND )
        {
            //scan min
            fValue[Minute] = negate * parseInt(fStart, end);
            fStart = end+1;
            designator = true;
        }

        end = indexOf(fStart, fEnd, DURATION_S);
        if ( end != NOT_FOUND )
        {
            //scan seconds
            int mlsec = indexOf (fStart, end, MILISECOND_SEPARATOR);

            /***
             * Schema Errata: E2-23
             * at least one digit must follow the decimal point if it appears.
             * That is, the value of the seconds component must conform
             * to the following pattern: [0-9]+(.[0-9]+)?
             */
            if ( mlsec != NOT_FOUND )
            {
                /***
                 * make usure there is something after the '.' and before the end.
                 */
                if ( mlsec+1 == end )
                {
                    ThrowXMLwithMemMgr1(SchemaDateTimeException
                            , XMLExcepts::DateTime_dur_inv_seconds
                            , fBuffer
                            , fMemoryManager);
                }

                fValue[Second]     = negate * parseInt(fStart, mlsec);
                fMilliSecond        = negate * parseMiliSecond(mlsec+1, end);
            }
            else
            {
                fValue[Second] = negate * parseInt(fStart,end);
            }

            fStart = end+1;
            designator = true;
        }

        // no additional data should appear after last item
        // P1Y1M1DT is illigal value as well
        if ( (fStart != fEnd) ||
              fBuffer[--fStart] == DATETIME_SEPARATOR )
        {
            ThrowXMLwithMemMgr1(SchemaDateTimeException
                    , XMLExcepts::DateTime_dur_NoTimeAfterT
                    , fBuffer
                    , fMemoryManager);
        }
    }

    if ( !designator )
    {
        ThrowXMLwithMemMgr1(SchemaDateTimeException
                , XMLExcepts::DateTime_dur_NoElementAtAll
                , fBuffer
                , fMemoryManager);
    }

}